

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sDrawTests.cpp
# Opt level: O2

void __thiscall deqp::gles31::Stress::anon_unknown_0::InvalidDrawCase::deinit(InvalidDrawCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  if (this->m_dataBufferID != 0) {
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_dataBufferID);
    this->m_dataBufferID = 0;
  }
  if (this->m_indexBufferID != 0) {
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x438))(1,&this->m_indexBufferID);
    this->m_indexBufferID = 0;
  }
  if (this->m_cmdBufferID != 0) {
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_01,iVar1) + 0x438))(1,&this->m_cmdBufferID);
    this->m_cmdBufferID = 0;
  }
  if (this->m_colorBufferID != 0) {
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_02,iVar1) + 0x438))(1,&this->m_colorBufferID);
    this->m_colorBufferID = 0;
  }
  if (this->m_vao != 0) {
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_03,iVar1) + 0x490))(1,&this->m_vao);
    this->m_vao = 0;
  }
  return;
}

Assistant:

void InvalidDrawCase::deinit (void)
{
	if (m_dataBufferID)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_dataBufferID);
		m_dataBufferID = 0;
	}
	if (m_indexBufferID)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_indexBufferID);
		m_indexBufferID = 0;
	}
	if (m_cmdBufferID)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_cmdBufferID);
		m_cmdBufferID = 0;
	}
	if (m_colorBufferID)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_colorBufferID);
		m_colorBufferID = 0;
	}
	if (m_vao)
	{
		m_context.getRenderContext().getFunctions().deleteVertexArrays(1, &m_vao);
		m_vao = 0;
	}
}